

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 value;
  int cached_size;
  LogMessage *pLVar1;
  MessageLite *pMVar2;
  MessageLite *prototype;
  LogMessage local_78;
  Voidify local_61;
  EpsCopyOutputStream *local_60;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ExtensionSet *pEStack_48;
  int number_local;
  ExtensionSet *extension_set_local;
  MessageLite *extendee_local;
  Extension *this_local;
  EpsCopyOutputStream *local_28;
  undefined4 local_1c;
  EpsCopyOutputStream *local_18;
  undefined4 local_c;
  
  local_60 = stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local._4_4_ = number;
  pEStack_48 = extension_set;
  extension_set_local = (ExtensionSet *)extendee;
  extendee_local = (MessageLite *)this;
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    this_local = (Extension *)target;
    if (((byte)this->field_0xa >> 1 & 1) == 0) {
      stream_local = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
      local_c = 0xb;
      local_18 = stream_local;
      stream_local = (EpsCopyOutputStream *)
                     io::CodedOutputStream::WriteVarint32ToArray(0xb,(uint8_t *)stream_local);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteUInt32ToArray
                               (2,target_local._4_4_,(uint8_t *)stream_local);
      if (((byte)this->field_0xa >> 2 & 1) == 0) {
        value = this->field_0;
        cached_size = MessageLite::GetCachedSize(this->field_0);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteMessage
                                 (3,(MessageLite *)value,cached_size,(uint8_t *)stream_local,
                                  local_60);
      }
      else {
        pMVar2 = GetPrototypeForLazyMessage
                           (pEStack_48,(MessageLite *)extension_set_local,target_local._4_4_);
        stream_local = (EpsCopyOutputStream *)
                       (**(code **)(**(long **)&(this->field_0).int32_t_value + 0xa0))
                                 (*(long **)&(this->field_0).int32_t_value,pMVar2,3,stream_local,
                                  local_60);
      }
      stream_local = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::EnsureSpace(local_60,(uint8_t *)stream_local);
      local_1c = 0xc;
      local_28 = stream_local;
      this_local = (Extension *)
                   io::CodedOutputStream::WriteVarint32ToArray(0xc,(uint8_t *)stream_local);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x7f1);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [31])"Invalid message set extension.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar1);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_78);
    this_local = (Extension *)
                 InternalSerializeFieldWithCachedSizesToArray
                           (this,(MessageLite *)extension_set_local,pEStack_48,target_local._4_4_,
                            (uint8_t *)stream_local,local_60);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    ABSL_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(extendee, extension_set,
                                                        number, target, stream);
  }

  if (is_cleared) return target;

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    const auto* prototype =
        extension_set->GetPrototypeForLazyMessage(extendee, number);
    target = ptr.lazymessage_value->WriteMessageToArray(
        prototype, WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, *ptr.message_value,
        ptr.message_value->GetCachedSize(), target, stream);
  }
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}